

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

double __thiscall AmpIO::ReadWatchdogPeriodInSeconds(AmpIO *this)

{
  BasePort *pBVar1;
  uint in_EAX;
  uint32_t counts;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
  if (pBVar1 != (BasePort *)0x0) {
    (*pBVar1->_vptr_BasePort[0x23])
              (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,3,(long)&uStack_8 + 4);
  }
  return (double)uStack_8._4_2_ * 5.208333333333333e-06;
}

Assistant:

double AmpIO::ReadWatchdogPeriodInSeconds(void) const
{
    return ReadWatchdogPeriod()*WDOG_ClockPeriod;
}